

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QMimeTypeXMLData * __thiscall
QHash<QString,_QMimeTypeXMLData>::value
          (QMimeTypeXMLData *__return_storage_ptr__,QHash<QString,_QMimeTypeXMLData> *this,
          QString *key)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  Node<QString,_QMimeTypeXMLData> *pNVar4;
  QMimeTypeXMLData *pQVar5;
  
  if (this->d != (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *)0x0) {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::findNode<QString>
                       (this->d,key);
    if (pNVar4 != (Node<QString,_QMimeTypeXMLData> *)0x0) {
      pQVar5 = &pNVar4->value;
      goto LAB_004bddad;
    }
  }
  pQVar5 = (QMimeTypeXMLData *)0x0;
LAB_004bddad:
  if (pQVar5 == (QMimeTypeXMLData *)0x0) {
    (__return_storage_ptr__->globPatterns).d.ptr = (QString *)0x0;
    (__return_storage_ptr__->globPatterns).d.size = 0;
    (__return_storage_ptr__->iconName).d.size = 0;
    (__return_storage_ptr__->globPatterns).d.d = (Data *)0x0;
    (__return_storage_ptr__->iconName).d.d = (Data *)0x0;
    (__return_storage_ptr__->iconName).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->genericIconName).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->genericIconName).d.size = 0;
    (__return_storage_ptr__->localeComments).d = (Data *)0x0;
    (__return_storage_ptr__->genericIconName).d.d = (Data *)0x0;
    (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->name).d.size = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->name).d.d = (Data *)0x0;
  }
  else {
    __return_storage_ptr__->hasGlobDeleteAll = pQVar5->hasGlobDeleteAll;
    pDVar1 = (pQVar5->name).d.d;
    (__return_storage_ptr__->name).d.d = pDVar1;
    (__return_storage_ptr__->name).d.ptr = (pQVar5->name).d.ptr;
    (__return_storage_ptr__->name).d.size = (pQVar5->name).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar2 = (pQVar5->localeComments).d;
    (__return_storage_ptr__->localeComments).d = pDVar2;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar1 = (pQVar5->genericIconName).d.d;
    (__return_storage_ptr__->genericIconName).d.d = pDVar1;
    (__return_storage_ptr__->genericIconName).d.ptr = (pQVar5->genericIconName).d.ptr;
    (__return_storage_ptr__->genericIconName).d.size = (pQVar5->genericIconName).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar1 = (pQVar5->iconName).d.d;
    (__return_storage_ptr__->iconName).d.d = pDVar1;
    (__return_storage_ptr__->iconName).d.ptr = (pQVar5->iconName).d.ptr;
    (__return_storage_ptr__->iconName).d.size = (pQVar5->iconName).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar3 = (pQVar5->globPatterns).d.d;
    (__return_storage_ptr__->globPatterns).d.d = pDVar3;
    (__return_storage_ptr__->globPatterns).d.ptr = (pQVar5->globPatterns).d.ptr;
    (__return_storage_ptr__->globPatterns).d.size = (pQVar5->globPatterns).d.size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }